

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Cex.c
# Opt level: O0

Abc_Cex_t * Llb4_Nonlin4NormalizeCex(Aig_Man_t *pAigOrg,Aig_Man_t *pAigRpm,Abc_Cex_t *pCexRpm)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *vStates_00;
  Vec_Ptr_t *vStates;
  Abc_Cex_t *pCexOrg;
  Abc_Cex_t *pCexRpm_local;
  Aig_Man_t *pAigRpm_local;
  Aig_Man_t *pAigOrg_local;
  
  iVar1 = Saig_ManRegNum(pAigOrg);
  iVar2 = Saig_ManRegNum(pAigRpm);
  if (iVar1 == iVar2) {
    iVar1 = Saig_ManPiNum(pAigRpm);
    if (iVar1 == pCexRpm->nPis) {
      vStates_00 = Llb4_Nonlin4VerifyCex(pAigRpm,pCexRpm);
      if (vStates_00 == (Vec_Ptr_t *)0x0) {
        Abc_Print(1,"Llb4_Nonlin4NormalizeCex(): The given CEX does not fail outputs of pAigRpm.\n")
        ;
        pAigOrg_local = (Aig_Man_t *)0x0;
      }
      else {
        pAigOrg_local = (Aig_Man_t *)Llb4_Nonlin4TransformCex(pAigOrg,vStates_00,pCexRpm->iPo,0);
        Vec_PtrFree(vStates_00);
      }
    }
    else {
      printf(
            "Llb4_Nonlin4NormalizeCex(): The number of PIs in the reparametrized AIG and in the CEX do not agree.\n"
            );
      pAigOrg_local = (Aig_Man_t *)0x0;
    }
  }
  else {
    printf(
          "Llb4_Nonlin4NormalizeCex(): The number of flops in the original and reparametrized AIGs do not agree.\n"
          );
    pAigOrg_local = (Aig_Man_t *)0x0;
  }
  return (Abc_Cex_t *)pAigOrg_local;
}

Assistant:

Abc_Cex_t * Llb4_Nonlin4NormalizeCex( Aig_Man_t * pAigOrg, Aig_Man_t * pAigRpm, Abc_Cex_t * pCexRpm )
{
    Abc_Cex_t * pCexOrg;
    Vec_Ptr_t * vStates;
    // check parameters of the AIG
    if ( Saig_ManRegNum(pAigOrg) != Saig_ManRegNum(pAigRpm) )
    {
        printf( "Llb4_Nonlin4NormalizeCex(): The number of flops in the original and reparametrized AIGs do not agree.\n" );
        return NULL;
    }
/*
    if ( Saig_ManRegNum(pAigRpm) != pCexRpm->nRegs )
    {
        printf( "Llb4_Nonlin4NormalizeCex(): The number of flops in the reparametrized AIG and in the CEX do not agree.\n" );
        return NULL;
    }
*/
    if ( Saig_ManPiNum(pAigRpm) != pCexRpm->nPis )
    {
        printf( "Llb4_Nonlin4NormalizeCex(): The number of PIs in the reparametrized AIG and in the CEX do not agree.\n" );
        return NULL;
    }
    // get the sequence of states
    vStates = Llb4_Nonlin4VerifyCex( pAigRpm, pCexRpm );
    if ( vStates == NULL )
    {
        Abc_Print( 1, "Llb4_Nonlin4NormalizeCex(): The given CEX does not fail outputs of pAigRpm.\n" );
        return NULL;
    }
    // derive updated counter-example
    pCexOrg = Llb4_Nonlin4TransformCex( pAigOrg, vStates, pCexRpm->iPo, 0 );
    Vec_PtrFree( vStates );
    return pCexOrg;
}